

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O1

bool __thiscall
ithipublisher::PrintVector
          (ithipublisher *this,FILE *F,vector<double,_std::allocator<double>_> *vx,double mult)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  
  iVar1 = fprintf((FILE *)F,"[");
  bVar2 = 0 < iVar1;
  if ((vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        iVar1 = fprintf((FILE *)F,", ");
        bVar2 = (bool)(bVar2 & 0 < iVar1);
      }
      iVar1 = fprintf((FILE *)F,"%8f",
                      (vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar3] * mult);
      bVar2 = (bool)(0 < iVar1 & bVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)(vx->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                   .super__Vector_impl_data._M_start >> 3));
  }
  iVar1 = fprintf((FILE *)F,"]");
  return (bool)(0 < iVar1 & bVar2);
}

Assistant:

bool ithipublisher::PrintVector(FILE * F, std::vector<double> * vx, double mult)
{
    bool ret = (fprintf(F, "[") > 0);
    for (size_t i = 0; i < vx->size(); i++)
    {
        if (i != 0)
        {
            ret &= fprintf(F, ", ") > 0;
        }

        ret &= fprintf(F, "%8f", mult*(*vx)[i]) > 0;
    }

    ret &= fprintf(F, "]") > 0;

    return ret;
}